

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Token * __thiscall
toml::internal::Lexer::nextStringDoubleQuote(Token *__return_storage_ptr__,Lexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  string codepoint;
  string s;
  string local_98;
  uint local_74;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  cVar2 = std::istream::peek();
  if (cVar2 != '\"') {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"string didn\'t start with \'\"\'","");
    __return_storage_ptr__->type_ = ERROR_TOKEN;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,local_70,local_70 + local_68);
    (__return_storage_ptr__->time_value_).__d.__r = 0;
    if (local_70 == &local_60) {
      return __return_storage_ptr__;
    }
    goto LAB_0013485b;
  }
  iVar3 = std::istream::get();
  if (iVar3 == 10) {
    this->lineNo_ = this->lineNo_ + 1;
  }
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_74 = std::istream::peek();
  if ((char)local_74 == '\"') {
    iVar3 = std::istream::get();
    if (iVar3 == 10) {
      this->lineNo_ = this->lineNo_ + 1;
    }
    uVar4 = std::istream::peek();
    uVar5 = local_74 & 0xff;
    if (uVar4 != 0xffffffff) {
      uVar5 = uVar4;
    }
    if (uVar4 != 0xffffffff && (char)uVar5 == '\"') {
      iVar3 = std::istream::get();
      while( true ) {
        if (iVar3 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        uVar4 = std::istream::peek();
        uVar5 = uVar5 & 0xff;
        if (uVar4 != 0xffffffff) {
          uVar5 = uVar4;
        }
        if ((uVar4 == 0xffffffff) || (((char)uVar5 != ' ' && ((uVar5 & 0xff) != 9)))) break;
        iVar3 = std::istream::get();
      }
      iVar3 = std::istream::peek();
      if ((iVar3 != -1) && (((char)iVar3 == '\n' && (iVar3 = std::istream::get(), iVar3 == 10)))) {
        this->lineNo_ = this->lineNo_ + 1;
      }
      goto LAB_001348ee;
    }
    paVar1 = &local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type_ = STRING;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,paVar1,paVar1);
    (__return_storage_ptr__->time_value_).__d.__r = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) goto LAB_00134cc6;
  }
  else {
LAB_001348ee:
LAB_001348fd:
    uVar5 = std::istream::peek();
    if (uVar5 != 0xffffffff) {
      iVar3 = std::istream::get();
      if (iVar3 == 10) {
        this->lineNo_ = this->lineNo_ + 1;
      }
      cVar2 = (char)&local_70;
      if ((char)uVar5 != '\"') {
        if ((uVar5 & 0xff) != 0x5c) goto LAB_00134b7e;
        uVar5 = std::istream::peek();
        if (uVar5 == 0xffffffff) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"string has unknown escape sequence","");
          __return_storage_ptr__->type_ = ERROR_TOKEN;
          (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->str_value_).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->str_value_,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          goto LAB_00134cb0;
        }
        iVar3 = std::istream::get();
        if (iVar3 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        uVar4 = uVar5 & 0xff;
        if (uVar4 < 0x55) {
          if (uVar4 == 10) {
            while (((uVar5 = std::istream::peek(), uVar5 != 0xffffffff && ((byte)uVar5 < 0x21)) &&
                   ((0x100002600U >> ((ulong)(uVar5 & 0xff) & 0x3f) & 1) != 0))) {
              iVar3 = std::istream::get();
              if (iVar3 == 10) {
                this->lineNo_ = this->lineNo_ + 1;
              }
            }
            goto LAB_001348fd;
          }
          if ((uVar4 != 0x22) && (uVar4 != 0x27)) {
switchD_00134a6a_caseD_6f:
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"string has unknown escape sequence","");
            __return_storage_ptr__->type_ = ERROR_TOKEN;
            (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->str_value_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->str_value_,local_98._M_dataplus._M_p,
                       local_98._M_dataplus._M_p + local_98._M_string_length);
            goto LAB_00134cb0;
          }
        }
        else {
          switch(uVar4) {
          case 0x6e:
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
            goto switchD_00134a6a_caseD_6f;
          case 0x72:
            break;
          case 0x74:
            break;
          case 0x75:
switchD_00134a6a_caseD_75:
            iVar3 = (uint)((char)uVar5 != 'u') * 4 + 4;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            local_98._M_string_length = 0;
            local_98.field_2._M_local_buf[0] = '\0';
            do {
              uVar5 = std::istream::peek();
              if ((uVar5 == 0xffffffff) ||
                 ((9 < (byte)((char)uVar5 - 0x30U) &&
                  ((uVar5 = (uVar5 & 0xff) - 0x41, 0x25 < uVar5 ||
                   ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))))) {
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"string has unknown escape sequence","");
                __return_storage_ptr__->type_ = ERROR_TOKEN;
                (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                     (pointer)&(__return_storage_ptr__->str_value_).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&__return_storage_ptr__->str_value_,local_50._M_dataplus._M_p,
                           local_50._M_dataplus._M_p + local_50._M_string_length);
                (__return_storage_ptr__->time_value_).__d.__r = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00134cb8;
              }
              std::__cxx11::string::push_back((char)&local_98);
              iVar6 = std::istream::get();
              if (iVar6 == 10) {
                this->lineNo_ = this->lineNo_ + 1;
              }
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            unescape(&local_50,&local_98);
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,
                              CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                       local_98.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_001348fd;
          default:
            if (uVar4 == 0x55) goto switchD_00134a6a_caseD_75;
            if (uVar4 != 0x5c) goto switchD_00134a6a_caseD_6f;
          }
        }
LAB_00134b7e:
        std::__cxx11::string::push_back(cVar2);
        goto LAB_001348fd;
      }
      if ((char)local_74 != '\"') {
        __return_storage_ptr__->type_ = STRING;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_70,local_70 + local_68);
LAB_00134d0a:
        (__return_storage_ptr__->time_value_).__d.__r = 0;
        goto LAB_00134d12;
      }
      iVar3 = std::istream::peek();
      if ((iVar3 == -1) || ((char)iVar3 != '\"')) {
        std::__cxx11::string::push_back(cVar2);
      }
      else {
        iVar3 = std::istream::get();
        if (iVar3 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        iVar3 = std::istream::peek();
        if ((iVar3 != -1) && ((char)iVar3 == '\"')) {
          iVar3 = std::istream::get();
          if (iVar3 == 10) {
            this->lineNo_ = this->lineNo_ + 1;
          }
          __return_storage_ptr__->type_ = MULTILINE_STRING;
          (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->str_value_).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->str_value_,local_70,local_70 + local_68);
          goto LAB_00134d0a;
        }
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
      goto LAB_001348fd;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"string didn\'t end","");
    __return_storage_ptr__->type_ = ERROR_TOKEN;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
LAB_00134cb0:
    (__return_storage_ptr__->time_value_).__d.__r = 0;
LAB_00134cb8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_00134cc6:
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_00134d12:
  if (local_70 == &local_60) {
    return __return_storage_ptr__;
  }
LAB_0013485b:
  operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  return __return_storage_ptr__;
}

Assistant:

inline Token Lexer::nextStringDoubleQuote()
{
    if (!consume('"'))
        return Token(TokenType::ERROR_TOKEN, std::string("string didn't start with '\"'"));

    std::string s;
    char c;
    bool multiline = false;

    if (current(&c) && c == '"') {
        next();
        if (!current(&c) || c != '"') {
            // OK. It's empty string.
            return Token(TokenType::STRING, std::string());
        }

        next();
        // raw string literal started.
        // Newline just after """ should be ignored.
        while (current(&c) && (c == ' ' || c == '\t'))
            next();
        if (current(&c) && c == '\n')
            next();
        multiline = true;
    }

    while (current(&c)) {
        next();
        if (c == '\\') {
            if (!current(&c))
                return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
            next();
            switch (c) {
            case 't': c = '\t'; break;
            case 'n': c = '\n'; break;
            case 'r': c = '\r'; break;
            case 'u':
            case 'U': {
                int size = c == 'u' ? 4 : 8;
                std::string codepoint;
                for (int i = 0; i < size; ++i) {
                  if (current(&c) && (('0' <= c && c <= '9') || ('A' <= c && c <= 'F') || ('a' <= c && c <= 'f'))) {
                    codepoint += c;
                    next();
                  } else {
                    return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
                  }
                }
                s += unescape(codepoint);
                continue;
            }
            case '"': c = '"'; break;
            case '\'': c = '\''; break;
            case '\\': c = '\\'; break;
            case '\n':
                while (current(&c) && (c == ' ' || c == '\t' || c == '\r' || c == '\n')) {
                    next();
                }
                continue;
            default:
                return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
            }
        } else if (c == '"') {
            if (multiline) {
                if (current(&c) && c == '"') {
                    next();
                    if (current(&c) && c == '"') {
                        next();
                        return Token(TokenType::MULTILINE_STRING, s);
                    } else {
                        s += '"';
                        s += '"';
                        continue;
                    }
                } else {
                    s += '"';
                    continue;
                }
            } else {
                return Token(TokenType::STRING, s);
            }
        }

        s += c;
    }

    return Token(TokenType::ERROR_TOKEN, std::string("string didn't end"));
}